

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition-optimizer.hxx
# Opt level: O1

Solution * __thiscall
lineage::heuristics::
PartitionOptimizerBase<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>_>
::getSolution(Solution *__return_storage_ptr__,
             PartitionOptimizerBase<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>_>
             *this)

{
  PartitionGraph *graph;
  ProblemGraph *pPVar1;
  pointer pEVar2;
  pointer pEVar3;
  double dVar4;
  pointer puVar5;
  bool bVar6;
  void *__dest;
  size_t __n;
  long lVar7;
  ulong uVar8;
  size_t edgeId;
  size_type __n_00;
  long lVar9;
  BranchingOptimizer branchingOptimizer;
  HungarianBranching<lineage::heuristics::PartitionGraph> local_70;
  
  graph = &this->partitionGraph_;
  branching::HungarianBranching<lineage::heuristics::PartitionGraph>::HungarianBranching
            (&local_70,graph);
  dVar4 = branching::HungarianBranching<lineage::heuristics::PartitionGraph>::optimize(&local_70);
  this->branchingObjective_ = dVar4;
  uVar8 = (long)local_70.solution_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_70.solution_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (uVar8 == 0) {
    __dest = (void *)0x0;
  }
  else {
    if ((long)uVar8 < 0) {
      std::__throw_bad_alloc();
    }
    __dest = operator_new(uVar8);
  }
  puVar5 = local_70.solution_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  __n = (long)local_70.solution_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_70.solution_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start;
  if (__n != 0) {
    memmove(__dest,local_70.solution_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,__n);
  }
  if (local_70.solution_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar5) {
    edgeId = 0;
    do {
      PartitionGraph::updateBranchingLabel(graph,edgeId,*(char *)((long)__dest + edgeId) != '\0');
      edgeId = edgeId + 1;
    } while (__n != edgeId);
  }
  if (__dest != (void *)0x0) {
    operator_delete(__dest,uVar8);
  }
  local_70.super_BranchingOptimizer<lineage::heuristics::PartitionGraph>._vptr_BranchingOptimizer =
       (_func_int **)&PTR_optimize_0014c888;
  if (local_70.solution_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.solution_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_70.solution_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.solution_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector(&local_70.partitions_);
  pPVar1 = ((this->super_HeuristicBase).data_)->problemGraph;
  pEVar2 = (pPVar1->graph_).edges_.
           super__Vector_base<andres::graph::detail::Edge<false,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<false,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pEVar3 = (pPVar1->graph_).edges_.
           super__Vector_base<andres::graph::detail::Edge<false,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<false,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  __n_00 = (long)pEVar3 - (long)pEVar2 >> 4;
  (__return_storage_ptr__->edge_labels).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->edge_labels).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->edge_labels).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
            (&__return_storage_ptr__->edge_labels,__n_00);
  if (pEVar3 != pEVar2) {
    lVar9 = __n_00 + (__n_00 == 0);
    lVar7 = 8;
    do {
      pEVar2 = (((this->super_HeuristicBase).data_)->problemGraph->graph_).edges_.
               super__Vector_base<andres::graph::detail::Edge<false,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<false,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      bVar6 = PartitionGraph::areConnected
                        (graph,*(size_t *)((long)pEVar2->vertexIndices_ + lVar7 + -8),
                         *(size_t *)((long)pEVar2->vertexIndices_ + lVar7));
      local_70.super_BranchingOptimizer<lineage::heuristics::PartitionGraph>.
      _vptr_BranchingOptimizer =
           (_func_int **)
           CONCAT44(local_70.super_BranchingOptimizer<lineage::heuristics::PartitionGraph>.
                    _vptr_BranchingOptimizer._4_4_,(uint)!bVar6);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<int>
                (&__return_storage_ptr__->edge_labels,(int *)&local_70);
      lVar7 = lVar7 + 0x10;
      lVar9 = lVar9 + -1;
    } while (lVar9 != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

inline Solution
PartitionOptimizerBase<BROPT>::getSolution()
{
    {
        // for the last time, optimize the branching to get
        // a final edge labelling.
        auto branchingOptimizer = BranchingOptimizer(partitionGraph_);
        branchingObjective_ = branchingOptimizer.optimize();

        size_t branchingEdgeId = 0;
        for (auto&& branchingEdgeLabel : branchingOptimizer.getSolution()) {
            partitionGraph_.updateBranchingLabel(branchingEdgeId++,
                                                 branchingEdgeLabel);
        }
    }

    // construct edge labels.
    const auto numberOfEdges = this->data_.problemGraph.graph().numberOfEdges();
    Solution solution;
    solution.edge_labels.reserve(numberOfEdges);

    for (size_t edge = 0; edge < numberOfEdges; ++edge) {
        const auto v0 = this->data_.problemGraph.graph().vertexOfEdge(edge, 0);
        const auto v1 = this->data_.problemGraph.graph().vertexOfEdge(edge, 1);

        solution.edge_labels.emplace_back(
            partitionGraph_.areConnected(v0, v1) ? 0 : 1);
    }
    return solution;
}